

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::Y_formatter::format
          (Y_formatter *this,log_msg *param_2,tm *tm_time,memory_buffer *dest)

{
  scoped_pad p;
  size_t field_size;
  scoped_pad *in_stack_ffffffffffffffa0;
  memory_buffer *in_stack_ffffffffffffffa8;
  padding_info *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  scoped_pad *in_stack_ffffffffffffffc0;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  
  scoped_pad::scoped_pad
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  fmt_helper::append_int<int,500ul>(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  scoped_pad::~scoped_pad(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 4;
        scoped_pad p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }